

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

bool __thiscall sglr::ReferenceContext::predrawErrorChecks(ReferenceContext *this,deUint32 mode)

{
  deBool dVar1;
  int iVar2;
  GeometryShaderInputType GVar3;
  deUint32 mode_local;
  ReferenceContext *this_local;
  
  do {
    if ((((((mode != 0) && (mode != 3)) && (mode != 2)) &&
         (((mode != 1 && (mode != 5)) && ((mode != 6 && ((mode != 4 && (mode != 10)))))))) &&
        (mode != 0xb)) && ((mode != 0xc && (mode != 0xd)))) {
      setError(this,0x500);
      return false;
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    iVar2 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca9);
    if (iVar2 != 0x8cd5) {
      setError(this,0x506);
      return false;
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  if ((this->m_currentProgram != (ShaderProgramObjectContainer *)0x0) &&
     ((this->m_currentProgram->m_program->m_hasGeometryShader & 1U) != 0)) {
    do {
      GVar3 = rr::GeometryShader::getInputType
                        (&this->m_currentProgram->m_program->super_GeometryShader);
      if ((GVar3 == GEOMETRYSHADERINPUTTYPE_POINTS) && (mode != 0)) {
        setError(this,0x502);
        return false;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      GVar3 = rr::GeometryShader::getInputType
                        (&this->m_currentProgram->m_program->super_GeometryShader);
      if ((((GVar3 == GEOMETRYSHADERINPUTTYPE_LINES) && (mode != 1)) && (mode != 3)) && (mode != 2))
      {
        setError(this,0x502);
        return false;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      GVar3 = rr::GeometryShader::getInputType
                        (&this->m_currentProgram->m_program->super_GeometryShader);
      if (((GVar3 == GEOMETRYSHADERINPUTTYPE_TRIANGLES) && (mode != 4)) &&
         ((mode != 5 && (mode != 6)))) {
        setError(this,0x502);
        return false;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      GVar3 = rr::GeometryShader::getInputType
                        (&this->m_currentProgram->m_program->super_GeometryShader);
      if (((GVar3 == GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY) && (mode != 10)) && (mode != 0xb)) {
        setError(this,0x502);
        return false;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      GVar3 = rr::GeometryShader::getInputType
                        (&this->m_currentProgram->m_program->super_GeometryShader);
      if (((GVar3 == GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY) && (mode != 0xc)) && (mode != 0xd)
         ) {
        setError(this,0x502);
        return false;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
  }
  return true;
}

Assistant:

bool ReferenceContext::predrawErrorChecks (deUint32 mode)
{
	RC_IF_ERROR(mode != GL_POINTS &&
				mode != GL_LINE_STRIP && mode != GL_LINE_LOOP && mode != GL_LINES &&
				mode != GL_TRIANGLE_STRIP && mode != GL_TRIANGLE_FAN && mode != GL_TRIANGLES &&
				mode != GL_LINES_ADJACENCY && mode != GL_LINE_STRIP_ADJACENCY &&
				mode != GL_TRIANGLES_ADJACENCY && mode != GL_TRIANGLE_STRIP_ADJACENCY,
				GL_INVALID_ENUM, false);

	// \todo [jarkko] Uncomment following code when the buffer mapping support is added
	//for (size_t ndx = 0; ndx < vao.m_arrays.size(); ++ndx)
	//	if (vao.m_arrays[ndx].enabled && vao.m_arrays[ndx].bufferBinding && vao.m_arrays[ndx].bufferBinding->isMapped)
	//		RC_ERROR_RET(GL_INVALID_OPERATION, RC_RET_VOID);

	RC_IF_ERROR(checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE, GL_INVALID_FRAMEBUFFER_OPERATION, false);

	// Geometry shader checks
	if (m_currentProgram && m_currentProgram->m_program->m_hasGeometryShader)
	{
		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_POINTS && mode != GL_POINTS, GL_INVALID_OPERATION, false);

		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_LINES &&
			(mode != GL_LINES &&
			 mode != GL_LINE_STRIP &&
			 mode != GL_LINE_LOOP),
			 GL_INVALID_OPERATION, false);

		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES &&
			(mode != GL_TRIANGLES &&
			 mode != GL_TRIANGLE_STRIP &&
			 mode != GL_TRIANGLE_FAN),
			 GL_INVALID_OPERATION, false);

		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY &&
			(mode != GL_LINES_ADJACENCY &&
			 mode != GL_LINE_STRIP_ADJACENCY),
			 GL_INVALID_OPERATION, false);

		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY &&
			(mode != GL_TRIANGLES_ADJACENCY &&
			 mode != GL_TRIANGLE_STRIP_ADJACENCY),
			 GL_INVALID_OPERATION, false);
	}

	return true;
}